

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O2

void secp256k1_modinv32(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  uint local_114;
  uint32_t c1;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_signed30 local_54;
  
  d.v[8] = 0;
  d.v[4] = 0;
  d.v[5] = 0;
  d.v[6] = 0;
  d.v[7] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  d.v[2] = 0;
  d.v[3] = 0;
  local_54.v[5] = 0;
  local_54.v[6] = 0;
  local_54.v[7] = 0;
  local_54.v[8] = 0;
  local_54.v[1] = 0;
  local_54.v[2] = 0;
  local_54.v[3] = 0;
  local_54.v[4] = 0;
  local_54.v[0] = 1;
  f.v[8] = (modinfo->modulus).v[8];
  f.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  f.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  f.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  f.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  g.v[8] = x->v[8];
  g.v._0_8_ = *(undefined8 *)x->v;
  g.v._8_8_ = *(undefined8 *)(x->v + 2);
  g.v._16_8_ = *(undefined8 *)(x->v + 4);
  g.v._24_8_ = *(undefined8 *)(x->v + 6);
  uVar10 = 0xffffffff;
  for (iVar4 = 0; iVar4 != 0x14; iVar4 = iVar4 + 1) {
    lVar1 = (long)f.v[0];
    lVar20 = (long)g.v[0];
    local_114 = 0;
    uVar14 = 1;
    uVar6 = 1;
    uVar16 = 0;
    iVar3 = 0;
    uVar11 = f.v[0];
    uVar13 = g.v[0];
    while( true ) {
      if (iVar3 == 0x1e) break;
      if ((uVar11 & 1) == 0) {
        pcVar12 = "test condition failed: (f & 1) == 1";
        uVar5 = 0xc0;
        goto LAB_00138db4;
      }
      if (uVar16 * g.v[0] + uVar14 * f.v[0] != uVar11 << ((byte)iVar3 & 0x1f)) {
        pcVar12 = "test condition failed: (u * f0 + v * g0) == f << i";
        uVar5 = 0xc1;
        goto LAB_00138db4;
      }
      if (uVar6 * g.v[0] + local_114 * f.v[0] != uVar13 << ((byte)iVar3 & 0x1f)) {
        pcVar12 = "test condition failed: (q * f0 + r * g0) == g << i";
        uVar5 = 0xc2;
        goto LAB_00138db4;
      }
      uVar7 = (int)uVar10 >> 0x1f;
      uVar15 = -(uVar13 & 1);
      uVar8 = uVar7 & uVar15;
      if ((uVar10 ^ uVar8) - 0x25b < 0xfffffb4d) {
        pcVar12 = "test condition failed: zeta >= -601 && zeta <= 601";
        uVar5 = 0xdd;
        goto LAB_00138db4;
      }
      uVar10 = (uVar10 ^ uVar8) - 1;
      uVar6 = uVar6 + ((uVar7 ^ uVar16) - uVar7 & uVar15);
      uVar16 = ((uVar6 & uVar8) + uVar16) * 2;
      local_114 = local_114 + ((uVar7 ^ uVar14) - uVar7 & uVar15);
      uVar14 = ((local_114 & uVar8) + uVar14) * 2;
      uVar15 = ((uVar7 ^ uVar11) - uVar7 & uVar15) + uVar13;
      uVar13 = uVar15 >> 1;
      uVar11 = uVar11 + (uVar15 & uVar8);
      iVar3 = iVar3 + 1;
    }
    t.q = local_114;
    lVar17 = (long)(int)uVar14;
    lVar19 = (long)(int)uVar6;
    lVar9 = (long)(int)uVar16;
    lVar18 = (long)(int)local_114;
    t.u = uVar14;
    t.v = uVar16;
    t.r = uVar6;
    if (lVar17 * lVar19 - lVar9 * lVar18 != 0x40000000) {
      pcVar12 = 
      "test condition failed: (int64_t)t->u * t->r - (int64_t)t->v * t->q == ((int64_t)1) << 30";
      uVar5 = 0xe8;
      goto LAB_00138db4;
    }
    secp256k1_modinv32_update_de_30(&d,&local_54,&t,modinfo);
    iVar3 = secp256k1_modinv32_mul_cmp_30(&f,9,&modinfo->modulus,-1);
    if (iVar3 < 1) {
      pcVar12 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0";
      uVar5 = 0x225;
      goto LAB_00138db4;
    }
    iVar3 = secp256k1_modinv32_mul_cmp_30(&f,9,&modinfo->modulus,1);
    if (0 < iVar3) {
      pcVar12 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0";
      uVar5 = 0x226;
      goto LAB_00138db4;
    }
    iVar3 = secp256k1_modinv32_mul_cmp_30(&g,9,&modinfo->modulus,-1);
    if (iVar3 < 1) {
      pcVar12 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0";
      uVar5 = 0x227;
      goto LAB_00138db4;
    }
    iVar3 = secp256k1_modinv32_mul_cmp_30(&g,9,&modinfo->modulus,1);
    if (-1 < iVar3) {
      pcVar12 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0";
      uVar5 = 0x228;
      goto LAB_00138db4;
    }
    uVar2 = lVar9 * lVar20 + lVar17 * lVar1;
    if ((uVar2 & 0x3fffffff) != 0) {
      pcVar12 = "test condition failed: ((int32_t)cf & M30) == 0";
      uVar5 = 0x1de;
      goto LAB_00138db4;
    }
    uVar21 = lVar20 * lVar19 + lVar1 * lVar18;
    if ((uVar21 & 0x3fffffff) != 0) {
      pcVar12 = "test condition failed: ((int32_t)cg & M30) == 0";
      uVar5 = 0x1df;
      goto LAB_00138db4;
    }
    lVar1 = 1;
    while( true ) {
      if (lVar1 == 9) break;
      uVar2 = f.v[lVar1] * lVar17 + ((long)uVar2 >> 0x1e) + g.v[lVar1] * lVar9;
      uVar21 = f.v[lVar1] * lVar18 + ((long)uVar21 >> 0x1e) + g.v[lVar1] * lVar19;
      f.v[lVar1 + -1] = (uint)uVar2 & 0x3fffffff;
      g.v[lVar1 + -1] = (uint)uVar21 & 0x3fffffff;
      lVar1 = lVar1 + 1;
    }
    f.v[8] = (int32_t)((long)uVar2 >> 0x1e);
    g.v[8] = (int32_t)((long)uVar21 >> 0x1e);
    iVar3 = secp256k1_modinv32_mul_cmp_30(&f,9,&modinfo->modulus,-1);
    if (iVar3 < 1) {
      pcVar12 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0";
      uVar5 = 0x22c;
      goto LAB_00138db4;
    }
    iVar3 = secp256k1_modinv32_mul_cmp_30(&f,9,&modinfo->modulus,1);
    if (0 < iVar3) {
      pcVar12 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0";
      uVar5 = 0x22d;
      goto LAB_00138db4;
    }
    iVar3 = secp256k1_modinv32_mul_cmp_30(&g,9,&modinfo->modulus,-1);
    if (iVar3 < 1) {
      pcVar12 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0";
      uVar5 = 0x22e;
      goto LAB_00138db4;
    }
    iVar3 = secp256k1_modinv32_mul_cmp_30(&g,9,&modinfo->modulus,1);
    if (-1 < iVar3) {
      pcVar12 = 
      "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0";
      uVar5 = 0x22f;
      goto LAB_00138db4;
    }
  }
  iVar4 = secp256k1_modinv32_mul_cmp_30(&g,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar4 == 0) {
    iVar4 = secp256k1_modinv32_mul_cmp_30(&f,9,&SECP256K1_SIGNED30_ONE,-1);
    if (iVar4 != 0) {
      iVar4 = secp256k1_modinv32_mul_cmp_30(&f,9,&SECP256K1_SIGNED30_ONE,1);
      if (iVar4 != 0) {
        iVar4 = secp256k1_modinv32_mul_cmp_30(x,9,&SECP256K1_SIGNED30_ONE,0);
        if (iVar4 == 0) {
          iVar4 = secp256k1_modinv32_mul_cmp_30(&d,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar4 == 0) {
            iVar4 = secp256k1_modinv32_mul_cmp_30(&f,9,&modinfo->modulus,1);
            if (iVar4 == 0) goto LAB_00138cde;
          }
        }
        pcVar12 = 
        "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, -1) == 0 || secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, 1) == 0 || (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 && secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 && secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) == 0)"
        ;
        uVar5 = 0x23d;
        goto LAB_00138db4;
      }
    }
LAB_00138cde:
    secp256k1_modinv32_normalize_30(&d,f.v[8],modinfo);
    x->v[8] = d.v[8];
    *(undefined8 *)(x->v + 4) = d.v._16_8_;
    *(undefined8 *)(x->v + 6) = d.v._24_8_;
    *(undefined8 *)x->v = d.v._0_8_;
    *(undefined8 *)(x->v + 2) = d.v._8_8_;
    return;
  }
  pcVar12 = 
  "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, 9, &SECP256K1_SIGNED30_ONE, 0) == 0";
  uVar5 = 0x237;
LAB_00138db4:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv32_impl.h"
          ,uVar5,pcVar12);
  abort();
}

Assistant:

static void secp256k1_modinv32(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv32_signed30 d = {{0}};
    secp256k1_modinv32_signed30 e = {{1}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int i;
    int32_t zeta = -1; /* zeta = -(delta+1/2); delta is initially 1/2. */

    /* Do 20 iterations of 30 divsteps each = 600 divsteps. 590 suffices for 256-bit inputs. */
    for (i = 0; i < 20; ++i) {
        /* Compute transition matrix and new zeta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        zeta = secp256k1_modinv32_divsteps_30(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30(&f, &g, &t);

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[8], modinfo);
    *x = d;
}